

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool __thiscall ArgsManager::ParseParameters(ArgsManager *this,int argc,char **argv,string *error)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar1;
  string key_00;
  bool bVar2;
  bool bVar3;
  long lVar4;
  size_type __pos;
  optional<unsigned_int> oVar5;
  mapped_type *pmVar6;
  SettingsValue *pSVar7;
  char **args;
  string *value_00;
  KeyInfo *this_01;
  long lVar8;
  char cVar9;
  char **__args;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffe70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  *this_02;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  optional<UniValue> value;
  string local_e8 [32];
  KeyInfo keyinfo;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> val;
  string key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock5,&this->cs_args,"cs_args",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
             ,0xb5,false);
  this_02 = &(this->m_settings).command_line_options;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
  ::clear(&this_02->_M_t);
  this_00 = &this->m_command;
  lVar4 = (long)argc;
  __args = argv + 1;
  lVar8 = 1;
  args = (char **)0x100000000;
  while( true ) {
    if (argc <= (int)lVar8) goto LAB_0056a50e;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&key,*__args,(allocator<char> *)&value);
    bVar2 = std::operator==(&key,"-");
    if (bVar2) goto LAB_0056a501;
    val.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&key,'=',0);
    if (__pos != 0xffffffffffffffff) {
      args = (char **)0xffffffffffffffff;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,&key,
                 __pos + 1,0xffffffffffffffff);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&val,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&key,__pos,0xffffffffffffffff);
    }
    if (*key._M_dataplus._M_p != '-') break;
    if ((1 < key._M_string_length) && (key._M_dataplus._M_p[1] == '-')) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&key,0,1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase(&key,0,1)
    ;
    std::__cxx11::string::string(local_e8,&key);
    key_00._M_string_length._0_4_ = in_stack_fffffffffffffe70;
    key_00._M_dataplus._M_p = (pointer)error;
    key_00._M_string_length._4_4_ = argc;
    key_00.field_2._M_allocated_capacity = (size_type)this_02;
    key_00.field_2._8_8_ = this;
    InterpretKey(&keyinfo,key_00);
    std::__cxx11::string::~string(local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,'-',
                   &keyinfo.name);
    oVar5 = GetArgFlags(this,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    if ((((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) ||
       (keyinfo.section._M_string_length != 0)) {
      tinyformat::format<char_const*>
                ((string *)&value,(tinyformat *)"Invalid parameter %s",(char *)__args,args);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
      std::__cxx11::string::~string((string *)&value);
      cVar9 = '\0';
    }
    else {
      value_00 = (string *)0x0;
      if (val.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged != false) {
        value_00 = (string *)&val;
      }
      args = (char **)((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_int> & 0xffffffff);
      InterpretValue(&value,&keyinfo,value_00,
                     oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload,error);
      cVar9 = value.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_engaged;
      if (value.super__Optional_base<UniValue,_false,_false>._M_payload.
          super__Optional_payload<UniValue,_true,_false,_false>.
          super__Optional_payload_base<UniValue>._M_engaged != false) {
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                 ::operator[](this_02,&keyinfo.name);
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back(pmVar6,(value_type *)&value);
      }
      std::_Optional_payload_base<UniValue>::_M_reset((_Optional_payload_base<UniValue> *)&value);
    }
    KeyInfo::~KeyInfo(&keyinfo);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&val);
    std::__cxx11::string::~string((string *)&key);
    __args = __args + 1;
    lVar8 = lVar8 + 1;
    if (cVar9 == '\0') goto LAB_0056a5a9;
  }
  if (((this->m_accept_any_command == false) &&
      ((this->m_command).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->m_command).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (oVar5 = GetArgFlags(this,&key),
     (~(ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> & 0x100000800) != 0)) {
    tinyformat::format<char_const*>
              ((string *)&value,(tinyformat *)"Invalid command \'%s\'",(char *)__args,
               (char **)0x100000800);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
    std::__cxx11::string::~string((string *)&value);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&val);
    this_01 = (KeyInfo *)&key;
    goto LAB_0056a5a4;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&key);
  while( true ) {
    __args = __args + 1;
    lVar8 = lVar8 + 1;
    if (lVar4 <= lVar8) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,__args);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&val);
LAB_0056a501:
  std::__cxx11::string::~string((string *)&key);
LAB_0056a50e:
  pmVar6 = common::
           FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>&,char_const(&)[12]>
                     (this_02,(char (*) [12])"includeconf");
  bVar2 = true;
  if (pmVar6 != (mapped_type *)0x0) {
    common::SettingsSpan::SettingsSpan((SettingsSpan *)&val,pmVar6);
    bVar3 = common::SettingsSpan::empty((SettingsSpan *)&val);
    if (!bVar3) {
      pSVar7 = common::SettingsSpan::begin((SettingsSpan *)&val);
      UniValue::write_abi_cxx11_((UniValue *)&keyinfo,(int)pSVar7,(void *)0x0,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                     "-includeconf cannot be used from commandline; -includeconf=",&keyinfo.name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
      std::__cxx11::string::~string((string *)&value);
      this_01 = &keyinfo;
LAB_0056a5a4:
      std::__cxx11::string::~string((string *)this_01);
LAB_0056a5a9:
      bVar2 = false;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock5.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ArgsManager::ParseParameters(int argc, const char* const argv[], std::string& error)
{
    LOCK(cs_args);
    m_settings.command_line_options.clear();

    for (int i = 1; i < argc; i++) {
        std::string key(argv[i]);

#ifdef MAC_OSX
        // At the first time when a user gets the "App downloaded from the
        // internet" warning, and clicks the Open button, macOS passes
        // a unique process serial number (PSN) as -psn_... command-line
        // argument, which we filter out.
        if (key.substr(0, 5) == "-psn_") continue;
#endif

        if (key == "-") break; //bitcoin-tx using stdin
        std::optional<std::string> val;
        size_t is_index = key.find('=');
        if (is_index != std::string::npos) {
            val = key.substr(is_index + 1);
            key.erase(is_index);
        }
#ifdef WIN32
        key = ToLower(key);
        if (key[0] == '/')
            key[0] = '-';
#endif

        if (key[0] != '-') {
            if (!m_accept_any_command && m_command.empty()) {
                // The first non-dash arg is a registered command
                std::optional<unsigned int> flags = GetArgFlags(key);
                if (!flags || !(*flags & ArgsManager::COMMAND)) {
                    error = strprintf("Invalid command '%s'", argv[i]);
                    return false;
                }
            }
            m_command.push_back(key);
            while (++i < argc) {
                // The remaining args are command args
                m_command.emplace_back(argv[i]);
            }
            break;
        }

        // Transform --foo to -foo
        if (key.length() > 1 && key[1] == '-')
            key.erase(0, 1);

        // Transform -foo to foo
        key.erase(0, 1);
        KeyInfo keyinfo = InterpretKey(key);
        std::optional<unsigned int> flags = GetArgFlags('-' + keyinfo.name);

        // Unknown command line options and command line options with dot
        // characters (which are returned from InterpretKey with nonempty
        // section strings) are not valid.
        if (!flags || !keyinfo.section.empty()) {
            error = strprintf("Invalid parameter %s", argv[i]);
            return false;
        }

        std::optional<common::SettingsValue> value = InterpretValue(keyinfo, val ? &*val : nullptr, *flags, error);
        if (!value) return false;

        m_settings.command_line_options[keyinfo.name].push_back(*value);
    }

    // we do not allow -includeconf from command line, only -noincludeconf
    if (auto* includes = common::FindKey(m_settings.command_line_options, "includeconf")) {
        const common::SettingsSpan values{*includes};
        // Range may be empty if -noincludeconf was passed
        if (!values.empty()) {
            error = "-includeconf cannot be used from commandline; -includeconf=" + values.begin()->write();
            return false; // pick first value as example
        }
    }
    return true;
}